

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.hpp
# Opt level: O0

string * pstore::path::posix::join(string *__return_storage_ptr__,string *path,string *b)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [24];
  string *b_local;
  string *path_local;
  
  local_30._16_8_ = b;
  b_local = path;
  path_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_50,(string *)b);
  local_30._0_8_ = &local_50;
  local_30._8_8_ = 1;
  join(__return_storage_ptr__,path,
       (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)local_30);
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30;
  do {
    local_88 = local_88 + -1;
    std::__cxx11::string::~string((string *)local_88);
  } while (local_88 != &local_50);
  return __return_storage_ptr__;
}

Assistant:

inline std::string join (std::string const & path, std::string const & b) {
                return join (path, {b});
            }